

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

void CollectHistogram_C(uint8_t *ref,uint8_t *pred,int start_block,int end_block,VP8Histogram *histo
                       )

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  VP8Histogram *in_R8;
  int clipped_value;
  int v;
  int16_t out [16];
  int k;
  int distribution [32];
  int j;
  int16_t local_d8 [22];
  int local_ac;
  int local_a8 [33];
  int local_24;
  VP8Histogram *local_20;
  int local_18;
  int local_14;
  long local_10;
  long local_8;
  
  local_20 = in_R8;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_a8,0,0x80);
  for (local_24 = local_14; local_24 < local_18; local_24 = local_24 + 1) {
    (*VP8FTransform)((uint8_t *)(local_8 + VP8DspScan[local_24]),
                     (uint8_t *)(local_10 + VP8DspScan[local_24]),local_d8);
    for (local_ac = 0; local_ac < 0x10; local_ac = local_ac + 1) {
      iVar1 = (int)local_d8[local_ac];
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      iVar1 = clip_max(iVar1 >> 3,0x1f);
      local_a8[iVar1] = local_a8[iVar1] + 1;
    }
  }
  VP8SetHistogramData(local_a8,local_20);
  return;
}

Assistant:

static void CollectHistogram_C(const uint8_t* WEBP_RESTRICT ref,
                               const uint8_t* WEBP_RESTRICT pred,
                               int start_block, int end_block,
                               VP8Histogram* WEBP_RESTRICT const histo) {
  int j;
  int distribution[MAX_COEFF_THRESH + 1] = { 0 };
  for (j = start_block; j < end_block; ++j) {
    int k;
    int16_t out[16];

    VP8FTransform(ref + VP8DspScan[j], pred + VP8DspScan[j], out);

    // Convert coefficients to bin.
    for (k = 0; k < 16; ++k) {
      const int v = abs(out[k]) >> 3;
      const int clipped_value = clip_max(v, MAX_COEFF_THRESH);
      ++distribution[clipped_value];
    }
  }
  VP8SetHistogramData(distribution, histo);
}